

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O1

zt_mem_pool * zt_mem_pool_get(char *name)

{
  char *__s;
  bool bVar1;
  int iVar2;
  size_t __n;
  size_t sVar3;
  zt_mem_pool *pzVar4;
  zt_mem_pool *unaff_R14;
  
  if ((name != (char *)0x0) &&
     (__n = strlen(name), pzVar4 = (zt_mem_pool *)pools.next, pools.next != &pools)) {
    do {
      __s = pzVar4->name;
      sVar3 = strlen(__s);
      if ((sVar3 == __n) && (iVar2 = strncmp(name,__s,__n), iVar2 == 0)) {
        bVar1 = false;
        unaff_R14 = pzVar4;
      }
      else {
        bVar1 = true;
      }
      if (!bVar1) {
        return unaff_R14;
      }
      pzVar4 = (zt_mem_pool *)(pzVar4->pool_list).next;
    } while (pzVar4 != (zt_mem_pool *)&pools);
  }
  return (zt_mem_pool *)0x0;
}

Assistant:

zt_mem_pool *
zt_mem_pool_get(char *name)
{
    size_t       nlen;
    zt_elist_t * tmp;

    if (!name) {
        return 0;
    }

    nlen = strlen(name);

    zt_elist_for_each(&pools, tmp) {
        zt_mem_pool * pool;
        size_t        olen;

        pool = zt_elist_data(tmp, zt_mem_pool, pool_list);
        olen = strlen(pool->name);

        if (olen == nlen && (strncmp(name, pool->name, nlen) == 0)) {
            return pool;
        }
    }

    return 0;
}